

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtendedKalmanFilter.cpp
# Opt level: O3

void __thiscall
iDynTree::DiscreteExtendedKalmanFilterHelper::DiscreteExtendedKalmanFilterHelper
          (DiscreteExtendedKalmanFilterHelper *this)

{
  this->_vptr_DiscreteExtendedKalmanFilterHelper = (_func_int **)&PTR___cxa_pure_virtual_00180a88;
  iDynTree::VectorDynSize::VectorDynSize(&this->m_x);
  iDynTree::VectorDynSize::VectorDynSize(&this->m_u);
  iDynTree::VectorDynSize::VectorDynSize(&this->m_y);
  iDynTree::VectorDynSize::VectorDynSize(&this->m_xhat);
  iDynTree::MatrixDynSize::MatrixDynSize(&this->m_F);
  iDynTree::MatrixDynSize::MatrixDynSize(&this->m_P);
  iDynTree::MatrixDynSize::MatrixDynSize(&this->m_Phat);
  iDynTree::MatrixDynSize::MatrixDynSize(&this->m_Q);
  iDynTree::MatrixDynSize::MatrixDynSize(&this->m_H);
  iDynTree::MatrixDynSize::MatrixDynSize(&this->m_S);
  iDynTree::MatrixDynSize::MatrixDynSize(&this->m_K);
  iDynTree::MatrixDynSize::MatrixDynSize(&this->m_R);
  this->m_initial_state_covariance_set = false;
  this->m_is_initialized = false;
  this->m_measurement_updated = false;
  this->m_input_updated = false;
  this->m_initial_state_set = false;
  return;
}

Assistant:

iDynTree::DiscreteExtendedKalmanFilterHelper::DiscreteExtendedKalmanFilterHelper()
{

}